

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_integer_attribute_decoder.cc
# Opt level: O3

bool __thiscall
draco::SequentialIntegerAttributeDecoder::DecodeIntegerValues
          (SequentialIntegerAttributeDecoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,DecoderBuffer *in_buffer)

{
  byte bVar1;
  PointAttribute *pPVar2;
  long lVar3;
  PredictionSchemeTypedDecoderInterface<int,_int> *pPVar4;
  __uniq_ptr_data<draco::DataBuffer,_std::default_delete<draco::DataBuffer>,_true,_true> _Var5;
  bool bVar6;
  char cVar7;
  uint num_components;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint32_t *out_values;
  long lVar12;
  ulong uVar13;
  
  num_components =
       (*(this->super_SequentialAttributeDecoder)._vptr_SequentialAttributeDecoder[0xb])();
  if ((int)num_components < 1) {
    return false;
  }
  lVar12 = (long)(point_ids->
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(point_ids->
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 2;
  PreparePortableAttribute(this,(int)lVar12,num_components);
  pPVar2 = (this->super_SequentialAttributeDecoder).portable_attribute_._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
           .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
  if (pPVar2->num_unique_entries_ == 0) {
    return false;
  }
  out_values = (uint32_t *)
               (*(long *)(pPVar2->super_GeometryAttribute).buffer_ +
               (pPVar2->super_GeometryAttribute).byte_offset_);
  if (out_values == (uint32_t *)0x0) {
    return false;
  }
  lVar3 = in_buffer->pos_;
  lVar11 = lVar3 + 1;
  if (in_buffer->data_size_ < lVar11) {
    return false;
  }
  uVar13 = lVar12 * (ulong)num_components;
  cVar7 = in_buffer->data_[lVar3];
  in_buffer->pos_ = lVar11;
  if (cVar7 == '\0') {
    if (in_buffer->data_size_ < lVar3 + 2) {
      return false;
    }
    bVar1 = in_buffer->data_[lVar11];
    uVar9 = (ulong)bVar1;
    in_buffer->pos_ = lVar3 + 2;
    uVar8 = DataTypeLength(DT_INT32);
    _Var5.super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>._M_t.
    super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
    super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl =
         (((this->super_SequentialAttributeDecoder).portable_attribute_._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
           .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl)->attribute_buffer_).
         _M_t.super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>;
    uVar10 = *(long *)((long)_Var5.
                             super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>
                             .super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl + 8) -
             *(long *)_Var5.
                      super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>
                      .super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl;
    if (uVar8 == bVar1) {
      uVar9 = uVar13 * 4;
      if (uVar10 < uVar9) {
        return false;
      }
      if (in_buffer->data_size_ < (long)(in_buffer->pos_ + uVar9)) {
        return false;
      }
      memcpy(out_values,in_buffer->data_ + in_buffer->pos_,uVar9);
      in_buffer->pos_ = in_buffer->pos_ + uVar9;
      goto LAB_001484f8;
    }
    if (uVar10 < uVar13 * uVar9) {
      return false;
    }
    lVar12 = in_buffer->pos_;
    if (in_buffer->data_size_ - lVar12 < (long)(uVar13 * uVar9)) {
      return false;
    }
    if (uVar13 != 0) {
      lVar11 = 0;
      do {
        if (in_buffer->data_size_ < (long)(lVar12 + uVar9)) {
          return false;
        }
        memcpy(out_values + lVar11,in_buffer->data_ + lVar12,uVar9);
        lVar12 = in_buffer->pos_ + uVar9;
        in_buffer->pos_ = lVar12;
        lVar11 = lVar11 + 1;
      } while (uVar13 - lVar11 != 0);
      goto LAB_00148501;
    }
  }
  else {
    bVar6 = DecodeSymbols((uint32_t)uVar13,num_components,in_buffer,out_values);
    if (!bVar6) {
      return false;
    }
LAB_001484f8:
    if (uVar13 != 0) {
LAB_00148501:
      pPVar4 = (this->prediction_scheme_)._M_t.
               super___uniq_ptr_impl<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
               .
               super__Head_base<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_false>
               ._M_head_impl;
      if ((pPVar4 == (PredictionSchemeTypedDecoderInterface<int,_int> *)0x0) ||
         (cVar7 = (**(code **)((long)(pPVar4->super_PredictionSchemeDecoderInterface).
                                     super_PredictionSchemeInterface + 0x40))(), cVar7 == '\0')) {
        ConvertSymbolsToSignedInts(out_values,(uint32_t)uVar13,(int32_t *)out_values);
      }
      bVar6 = false;
      goto LAB_00148622;
    }
  }
  bVar6 = true;
LAB_00148622:
  pPVar4 = (this->prediction_scheme_)._M_t.
           super___uniq_ptr_impl<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
           .super__Head_base<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_false>.
           _M_head_impl;
  if ((pPVar4 != (PredictionSchemeTypedDecoderInterface<int,_int> *)0x0) &&
     ((cVar7 = (**(code **)((long)(pPVar4->super_PredictionSchemeDecoderInterface).
                                  super_PredictionSchemeInterface + 0x50))(pPVar4,in_buffer),
      cVar7 == '\0' ||
      ((!bVar6 &&
       (pPVar4 = (this->prediction_scheme_)._M_t.
                 super___uniq_ptr_impl<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
                 .
                 super__Head_base<0UL,_draco::PredictionSchemeTypedDecoderInterface<int,_int>_*,_false>
                 ._M_head_impl,
       cVar7 = (**(code **)((long)(pPVar4->super_PredictionSchemeDecoderInterface).
                                  super_PredictionSchemeInterface + 0x58))
                         (pPVar4,out_values,out_values,uVar13 & 0xffffffff,num_components,
                          (point_ids->
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start), cVar7 == '\0')))))) {
    return false;
  }
  return true;
}

Assistant:

bool SequentialIntegerAttributeDecoder::DecodeIntegerValues(
    const std::vector<PointIndex> &point_ids, DecoderBuffer *in_buffer) {
  const int num_components = GetNumValueComponents();
  if (num_components <= 0) {
    return false;
  }
  const size_t num_entries = point_ids.size();
  const size_t num_values = num_entries * num_components;
  PreparePortableAttribute(static_cast<int>(num_entries), num_components);
  int32_t *const portable_attribute_data = GetPortableAttributeData();
  if (portable_attribute_data == nullptr) {
    return false;
  }
  uint8_t compressed;
  if (!in_buffer->Decode(&compressed)) {
    return false;
  }
  if (compressed > 0) {
    // Decode compressed values.
    if (!DecodeSymbols(static_cast<uint32_t>(num_values), num_components,
                       in_buffer,
                       reinterpret_cast<uint32_t *>(portable_attribute_data))) {
      return false;
    }
  } else {
    // Decode the integer data directly.
    // Get the number of bytes for a given entry.
    uint8_t num_bytes;
    if (!in_buffer->Decode(&num_bytes)) {
      return false;
    }
    if (num_bytes == DataTypeLength(DT_INT32)) {
      if (portable_attribute()->buffer()->data_size() <
          sizeof(int32_t) * num_values) {
        return false;
      }
      if (!in_buffer->Decode(portable_attribute_data,
                             sizeof(int32_t) * num_values)) {
        return false;
      }
    } else {
      if (portable_attribute()->buffer()->data_size() <
          num_bytes * num_values) {
        return false;
      }
      if (in_buffer->remaining_size() <
          static_cast<int64_t>(num_bytes) * static_cast<int64_t>(num_values)) {
        return false;
      }
      for (size_t i = 0; i < num_values; ++i) {
        if (!in_buffer->Decode(portable_attribute_data + i, num_bytes)) {
          return false;
        }
      }
    }
  }

  if (num_values > 0 && (prediction_scheme_ == nullptr ||
                         !prediction_scheme_->AreCorrectionsPositive())) {
    // Convert the values back to the original signed format.
    ConvertSymbolsToSignedInts(
        reinterpret_cast<const uint32_t *>(portable_attribute_data),
        static_cast<int>(num_values), portable_attribute_data);
  }

  // If the data was encoded with a prediction scheme, we must revert it.
  if (prediction_scheme_) {
    if (!prediction_scheme_->DecodePredictionData(in_buffer)) {
      return false;
    }

    if (num_values > 0) {
      if (!prediction_scheme_->ComputeOriginalValues(
              portable_attribute_data, portable_attribute_data,
              static_cast<int>(num_values), num_components, point_ids.data())) {
        return false;
      }
    }
  }
  return true;
}